

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubicLattice.cpp
# Opt level: O2

void __thiscall CubicLattice::createUpEdgesMap(CubicLattice *this)

{
  double dVar1;
  _Vector_base<int,_std::allocator<int>_> *p_Var2;
  bool bVar3;
  long lVar4;
  pointer __x;
  uint uVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator local_199;
  double local_198;
  int local_18c;
  vvint vertexToUpEdges;
  allocator_type local_166;
  allocator local_165;
  allocator local_164;
  allocator local_163;
  allocator local_162;
  allocator local_161;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
  *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directionList;
  undefined1 local_138 [64];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [40];
  
  std::__cxx11::string::string((string *)local_138,"xyz",(allocator *)&vertexToUpEdges);
  std::__cxx11::string::string((string *)(local_138 + 0x20),"xy",(allocator *)&local_18c);
  std::__cxx11::string::string(local_f8,"xz",&local_199);
  std::__cxx11::string::string(local_d8,"yz",&local_161);
  std::__cxx11::string::string(local_b8,"-xyz",&local_162);
  std::__cxx11::string::string(local_98,"-xy",&local_163);
  std::__cxx11::string::string(local_78,"-xz",&local_164);
  std::__cxx11::string::string(local_58,"-yz",&local_165);
  __l._M_len = 8;
  __l._M_array = (iterator)local_138;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&directionList,__l,&local_166);
  lVar4 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  local_158 = directionList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_160 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
               *)&(this->super_Lattice).upEdgesMap;
  __x = directionList.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__x == local_158) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&directionList);
      return;
    }
    vertexToUpEdges.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vertexToUpEdges.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vertexToUpEdges.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dVar1 = pow((double)(this->super_Lattice).l,3.0);
    local_138._0_8_ = (pointer)0x0;
    local_138._8_8_ = 0;
    local_138._16_8_ = 0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::_M_fill_assign(&vertexToUpEdges,
                     (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1,
                     (value_type *)local_138);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)local_138);
    uVar5 = 0;
    lVar4 = 0;
    while( true ) {
      local_198 = (double)(int)uVar5;
      dVar1 = pow((double)(this->super_Lattice).l,3.0);
      if (dVar1 <= local_198) break;
      bVar3 = std::operator==(__x,"xyz");
      if (bVar3) {
        p_Var2 = &(vertexToUpEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<int,_std::allocator<int>_>;
        std::__cxx11::string::string((string *)local_138,"x",&local_199);
        local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                              (this,(ulong)uVar5,
                               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                *)local_138,1);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c);
        std::__cxx11::string::~string((string *)local_138);
        p_Var2 = &(vertexToUpEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<int,_std::allocator<int>_>;
        std::__cxx11::string::string((string *)local_138,"y",&local_199);
        local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                              (this,(ulong)uVar5,
                               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                *)local_138,1);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c);
        std::__cxx11::string::~string((string *)local_138);
        p_Var2 = &(vertexToUpEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<int,_std::allocator<int>_>;
        std::__cxx11::string::string((string *)local_138,"z",&local_199);
        local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                              (this,(ulong)uVar5,
                               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                *)local_138,1);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c);
LAB_0012bc96:
        std::__cxx11::string::~string((string *)local_138);
      }
      else {
        bVar3 = std::operator==(__x,"xy");
        if (bVar3) {
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"x",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,1);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          std::__cxx11::string::~string((string *)local_138);
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"y",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,1);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          std::__cxx11::string::~string((string *)local_138);
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"z",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,0xffffffffffffffff);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          goto LAB_0012bc96;
        }
        bVar3 = std::operator==(__x,"xz");
        if (bVar3) {
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"x",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,1);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          std::__cxx11::string::~string((string *)local_138);
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"y",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,0xffffffffffffffff);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          std::__cxx11::string::~string((string *)local_138);
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"z",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,1);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          goto LAB_0012bc96;
        }
        bVar3 = std::operator==(__x,"yz");
        if (bVar3) {
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"x",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,0xffffffffffffffff);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          std::__cxx11::string::~string((string *)local_138);
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"y",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,1);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          std::__cxx11::string::~string((string *)local_138);
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"z",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,1);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          goto LAB_0012bc96;
        }
        bVar3 = std::operator==(__x,"-xyz");
        if (bVar3) {
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"x",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,0xffffffffffffffff);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          std::__cxx11::string::~string((string *)local_138);
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"y",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,0xffffffffffffffff);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          std::__cxx11::string::~string((string *)local_138);
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"z",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,0xffffffffffffffff);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          goto LAB_0012bc96;
        }
        bVar3 = std::operator==(__x,"-xy");
        if (bVar3) {
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"x",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,0xffffffffffffffff);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          std::__cxx11::string::~string((string *)local_138);
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"y",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,0xffffffffffffffff);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          std::__cxx11::string::~string((string *)local_138);
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"z",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,1);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          goto LAB_0012bc96;
        }
        bVar3 = std::operator==(__x,"-xz");
        if (bVar3) {
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"x",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,0xffffffffffffffff);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          std::__cxx11::string::~string((string *)local_138);
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"y",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,1);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          std::__cxx11::string::~string((string *)local_138);
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"z",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,0xffffffffffffffff);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          goto LAB_0012bc96;
        }
        bVar3 = std::operator==(__x,"-yz");
        if (bVar3) {
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"x",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,1);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          std::__cxx11::string::~string((string *)local_138);
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"y",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,0xffffffffffffffff);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          std::__cxx11::string::~string((string *)local_138);
          p_Var2 = &(vertexToUpEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>;
          std::__cxx11::string::string((string *)local_138,"z",&local_199);
          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                (this,(ulong)uVar5,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_138,0xffffffffffffffff);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar4),&local_18c)
          ;
          goto LAB_0012bc96;
        }
      }
      lVar4 = lVar4 + 0x18;
      uVar5 = uVar5 + 1;
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::
    pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                *)local_138,__x,&vertexToUpEdges);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
    ::
    _M_emplace_unique<std::pair<std::__cxx11::string,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
              (local_160,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                *)local_138);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
             *)local_138);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&vertexToUpEdges);
    __x = __x + 1;
  } while( true );
}

Assistant:

void CubicLattice::createUpEdgesMap()
{
    std::vector<std::string> directionList = {"xyz", "xy", "xz", "yz",
                                              "-xyz", "-xy", "-xz", "-yz"};
    for (const auto &direction : directionList)
    {
        vvint vertexToUpEdges;
        vertexToUpEdges.assign(pow(l, 3), {});
        for (int vertexIndex = 0; vertexIndex < pow(l, 3); ++vertexIndex)
        {
            // cartesian4 coordinate = indexToCoordinate(vertexIndex);
            if (direction == "xyz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", 1));
                }
                catch(const std::invalid_argument& e)
                {
                    // Edge to vertex outside lattice
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "xy")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "xz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "yz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "-xyz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "-xy")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "-xz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "-yz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
        }
        upEdgesMap.insert(std::pair<std::string, vvint>(direction, vertexToUpEdges));
    }
}